

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool print_debug;
  uint __val;
  uint uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  ostream *poVar12;
  ssize_t sVar13;
  long *plVar14;
  size_type *psVar15;
  ulong uVar16;
  long lVar17;
  uint __len;
  uint uVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_25;
  string line;
  string filename;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  rules;
  string read_string;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  string token;
  Tokenizer tokenizer;
  vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
  table;
  Parser parser;
  ParseTableCalculation table_calculation;
  allocator_type local_e1b;
  allocator_type local_e1a;
  allocator_type local_e19;
  allocator_type local_e18;
  allocator_type local_e17;
  allocator_type local_e16;
  allocator_type local_e15;
  allocator_type local_e14;
  allocator_type local_e13;
  allocator_type local_e12;
  allocator_type local_e11;
  allocator_type local_e10;
  allocator_type local_e0f;
  allocator_type local_e0e;
  allocator_type local_e0d;
  allocator_type local_e0c;
  allocator_type local_e0b;
  allocator_type local_e0a;
  allocator_type local_e09;
  allocator_type local_e08;
  allocator_type local_e07;
  allocator_type local_e06;
  allocator_type local_e05;
  allocator_type local_e04;
  allocator_type local_e03;
  allocator_type local_e02;
  allocator_type local_e01;
  string *local_e00;
  string *local_df8;
  string *local_df0;
  string *local_de8;
  string *local_de0;
  string *local_dd8;
  string *local_dd0;
  string *local_dc8;
  string *local_dc0;
  string *local_db8;
  string *local_db0;
  string *local_da8;
  string *local_da0;
  string *local_d98;
  string *local_d90;
  string *local_d88;
  string *local_d80;
  string *local_d78;
  string *local_d70;
  string *local_d68;
  string *local_d60;
  string *local_d58;
  string *local_d50;
  string *local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  undefined1 *local_d20 [2];
  undefined1 local_d10 [16];
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [16];
  undefined1 *local_ce0 [2];
  undefined1 local_cd0 [16];
  string local_cc0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  undefined1 *local_c68 [2];
  undefined1 local_c58 [16];
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  undefined1 *local_c28 [2];
  undefined1 local_c18 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  undefined1 *local_be8 [2];
  undefined1 local_bd8 [16];
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  undefined1 *local_ba8 [2];
  undefined1 local_b98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  undefined1 *local_b28 [2];
  undefined1 local_b18 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  undefined1 *local_ac8 [2];
  undefined1 local_ab8 [16];
  undefined1 *local_aa8 [2];
  undefined1 local_a98 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  undefined1 *local_9f0 [2];
  undefined1 local_9e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  undefined1 *local_9b0 [2];
  undefined1 local_9a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 *local_970 [2];
  undefined1 local_960 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  undefined1 *local_930 [2];
  undefined1 local_920 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  undefined1 *local_8f0 [2];
  undefined1 local_8e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  undefined1 *local_8b0 [2];
  undefined1 local_8a0 [16];
  undefined1 *local_890 [2];
  undefined1 local_880 [16];
  undefined1 *local_870 [2];
  undefined1 local_860 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  undefined1 *local_810 [2];
  undefined1 local_800 [16];
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  undefined1 *local_7b0 [2];
  undefined1 local_7a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 *local_770 [2];
  undefined1 local_760 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  undefined1 *local_710 [2];
  undefined1 local_700 [16];
  undefined1 *local_6f0 [2];
  undefined1 local_6e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  undefined1 *local_6b0 [2];
  undefined1 local_6a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 *local_670 [2];
  undefined1 local_660 [16];
  undefined1 *local_650 [2];
  undefined1 local_640 [16];
  undefined1 *local_630 [2];
  undefined1 local_620 [16];
  undefined1 local_610 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b0;
  undefined1 local_598 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_580;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_550;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_520;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_490;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 *local_360;
  undefined1 local_350 [8];
  undefined1 local_348 [8];
  undefined1 *local_340 [2];
  undefined1 local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"filename","");
  parseArguments((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_a88,&local_d0,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pcVar1 = local_610 + 0x10;
  local_610._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"help","");
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_a88,(key_type *)local_610);
  if ((pointer)local_610._0_8_ != pcVar1) {
    operator_delete((void *)local_610._0_8_);
  }
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_610._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"filename","");
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_a88,(key_type *)local_610);
    if ((pointer)local_610._0_8_ != pcVar1) {
      operator_delete((void *)local_610._0_8_);
    }
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      local_610._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"No file provided","");
      printError((string *)local_610);
      if ((pointer)local_610._0_8_ != pcVar1) {
        operator_delete((void *)local_610._0_8_);
      }
      iVar5 = -1;
      printHelp();
    }
    else {
      local_610._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"tokenizer_debug","");
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_a88,(key_type *)local_610);
      if ((pointer)local_610._0_8_ != pcVar1) {
        operator_delete((void *)local_610._0_8_);
      }
      local_610._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"table_debug","");
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_a88,(key_type *)local_610);
      if ((pointer)local_610._0_8_ != pcVar1) {
        operator_delete((void *)local_610._0_8_);
      }
      local_610._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"parser_debug","");
      iVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&local_a88,(key_type *)local_610);
      if ((pointer)local_610._0_8_ != pcVar1) {
        operator_delete((void *)local_610._0_8_);
      }
      local_610._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"debug","");
      iVar11 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&local_a88,(key_type *)local_610);
      if ((pointer)local_610._0_8_ != pcVar1) {
        operator_delete((void *)local_610._0_8_);
      }
      print_debug = iVar10.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur != (__node_type *)0x0 ||
                    iVar11.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur != (__node_type *)0x0;
      local_610._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"ast","");
      iVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&local_a88,(key_type *)local_610);
      if ((pointer)local_610._0_8_ != pcVar1) {
        operator_delete((void *)local_610._0_8_);
      }
      local_cc0._M_dataplus._M_p = (pointer)&local_cc0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_cc0,
                 *(long *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 0x28),
                 *(long *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 0x30) +
                 *(long *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 0x28));
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"program","");
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"commands","");
      local_d88 = (string *)local_f0;
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>(local_d88,"EOF","");
      __l._M_len = 3;
      __l._M_array = &local_130;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_610,__l,&local_e01);
      local_3a0._0_8_ = local_3a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"commands","");
      local_380._0_8_ = local_380 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"command","");
      local_360 = local_350;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"SEMICOLON","");
      local_db8 = (string *)local_340;
      local_340[0] = local_330;
      std::__cxx11::string::_M_construct<char_const*>(local_db8,"commands","");
      __l_00._M_len = 4;
      __l_00._M_array = (iterator)local_3a0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_610 + 0x18),__l_00,&local_e02);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"commands","");
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"block","");
      local_d90 = (string *)local_150;
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>(local_d90,"commands","");
      __l_01._M_len = 3;
      __l_01._M_array = &local_190;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_610 + 0x30),__l_01,&local_e03);
      local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"commands","");
      local_d48 = (string *)local_6b0;
      local_6b0[0] = local_6a0;
      std::__cxx11::string::_M_construct<char_const*>(local_d48,"");
      __l_02._M_len = 2;
      __l_02._M_array = &local_6d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_610 + 0x48),__l_02,&local_e04);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"command","");
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"PRINT","");
      local_d98 = (string *)local_1b0;
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>(local_d98,"rvalue","");
      __l_03._M_len = 3;
      __l_03._M_array = &local_1f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_5b0,__l_03,&local_e05);
      local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"command","");
      local_730[0] = local_720;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"VARIABLE","");
      local_710[0] = local_700;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"ASSIGN","");
      local_dc0 = (string *)local_6f0;
      local_6f0[0] = local_6e0;
      std::__cxx11::string::_M_construct<char_const*>(local_dc0,"rvalue","");
      __l_04._M_len = 4;
      __l_04._M_array = &local_750;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_598,__l_04,&local_e06);
      local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"command","");
      local_d50 = (string *)local_770;
      local_770[0] = local_760;
      std::__cxx11::string::_M_construct<char_const*>(local_d50,"function_call","");
      __l_05._M_len = 2;
      __l_05._M_array = &local_790;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_580,__l_05,&local_e07);
      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"command","");
      local_d58 = (string *)local_7b0;
      local_7b0[0] = local_7a0;
      std::__cxx11::string::_M_construct<char_const*>(local_d58,"return","");
      __l_06._M_len = 2;
      __l_06._M_array = &local_7d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_568,__l_06,&local_e08);
      local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"block","");
      local_8b0[0] = local_8a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"OPEN_CURLY_BRACKET","");
      local_890[0] = local_880;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"commands","");
      local_dc8 = (string *)local_870;
      local_870[0] = local_860;
      std::__cxx11::string::_M_construct<char_const*>(local_dc8,"CLOSE_CURLY_BRACKET","");
      __l_07._M_len = 4;
      __l_07._M_array = &local_8d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_550,__l_07,&local_e09);
      local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b88,"function","");
      local_b68[0] = local_b58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"FUNCTION","");
      local_b48[0] = local_b38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"parameter_list","");
      local_dd0 = (string *)local_b28;
      local_b28[0] = local_b18;
      std::__cxx11::string::_M_construct<char_const*>(local_dd0,"block","");
      __l_08._M_len = 4;
      __l_08._M_array = &local_b88;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_538,__l_08,&local_e0a);
      local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d40,"parameter_list","");
      local_d20[0] = local_d10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"OPEN_BRACKET","");
      local_d00[0] = local_cf0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d00,"parameters","");
      local_ce0[0] = local_cd0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ce0,"CLOSE_BRACKET","");
      __l_09._M_len = 4;
      __l_09._M_array = &local_d40;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_520,__l_09,&local_e0b);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"parameter_list","");
      local_230[0] = local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"OPEN_BRACKET","");
      local_da0 = (string *)local_210;
      local_210[0] = local_200;
      std::__cxx11::string::_M_construct<char_const*>(local_da0,"CLOSE_BRACKET","");
      __l_10._M_len = 3;
      __l_10._M_array = &local_250;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_508,__l_10,&local_e0c);
      local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"parameters","");
      local_ae8[0] = local_ad8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"parameter","");
      local_ac8[0] = local_ab8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"COMMA","");
      local_dd8 = (string *)local_aa8;
      local_aa8[0] = local_a98;
      std::__cxx11::string::_M_construct<char_const*>(local_dd8,"parameters","");
      __l_11._M_len = 4;
      __l_11._M_array = &local_b08;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4f0,__l_11,&local_e0d);
      local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"parameters","");
      local_d60 = (string *)local_8f0;
      local_8f0[0] = local_8e0;
      std::__cxx11::string::_M_construct<char_const*>(local_d60,"parameter","");
      __l_12._M_len = 2;
      __l_12._M_array = &local_910;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4d8,__l_12,&local_e0e);
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"parameter","");
      local_d68 = (string *)local_930;
      local_930[0] = local_920;
      std::__cxx11::string::_M_construct<char_const*>(local_d68,"VARIABLE","");
      __l_13._M_len = 2;
      __l_13._M_array = &local_950;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4c0,__l_13,&local_e0f);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"function_call","");
      local_290[0] = local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"VARIABLE","");
      local_da8 = (string *)local_270;
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>(local_da8,"parameter_list","");
      __l_14._M_len = 3;
      __l_14._M_array = &local_2b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4a8,__l_14,&local_e10);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"return","");
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"RETURN","");
      local_db0 = (string *)local_2d0;
      local_2d0[0] = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>(local_db0,"rvalue","");
      __l_15._M_len = 3;
      __l_15._M_array = &local_310;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_490,__l_15,&local_e11);
      local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c08,"rvalue","");
      local_be8[0] = local_bd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"rvalue","");
      local_bc8[0] = local_bb8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"SUB","");
      local_de0 = (string *)local_ba8;
      local_ba8[0] = local_b98;
      std::__cxx11::string::_M_construct<char_const*>(local_de0,"rvalue","");
      __l_16._M_len = 4;
      __l_16._M_array = &local_c08;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_478,__l_16,&local_e12);
      local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"rvalue","");
      local_c68[0] = local_c58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"rvalue","");
      local_c48[0] = local_c38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"ADD","");
      local_de8 = (string *)local_c28;
      local_c28[0] = local_c18;
      std::__cxx11::string::_M_construct<char_const*>(local_de8,"rvalue","");
      __l_17._M_len = 4;
      __l_17._M_array = &local_c88;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_460,__l_17,&local_e13);
      local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"rvalue","");
      local_830[0] = local_820;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"rvalue","");
      local_810[0] = local_800;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_810,"MUL","");
      local_df0 = (string *)local_7f0;
      local_7f0[0] = local_7e0;
      std::__cxx11::string::_M_construct<char_const*>(local_df0,"rvalue","");
      __l_18._M_len = 4;
      __l_18._M_array = &local_850;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_448,__l_18,&local_e14);
      local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"rvalue","");
      local_670[0] = local_660;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"rvalue","");
      local_650[0] = local_640;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"DIV","");
      local_df8 = (string *)local_630;
      local_630[0] = local_620;
      std::__cxx11::string::_M_construct<char_const*>(local_df8,"rvalue","");
      __l_19._M_len = 4;
      __l_19._M_array = &local_690;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_430,__l_19,&local_e15);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rvalue","");
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"OPEN_BRACKET","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"rvalue","");
      local_e00 = (string *)local_50;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>(local_e00,"CLOSE_BRACKET","");
      __l_20._M_len = 4;
      __l_20._M_array = &local_b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_418,__l_20,&local_e16);
      local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"rvalue","");
      local_d70 = (string *)local_970;
      local_970[0] = local_960;
      std::__cxx11::string::_M_construct<char_const*>(local_d70,"STRING","");
      __l_21._M_len = 2;
      __l_21._M_array = &local_990;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_400,__l_21,&local_e17);
      local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"rvalue","");
      local_9b0[0] = local_9a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9b0,"NUMBER","");
      __l_22._M_len = 2;
      __l_22._M_array = &local_9d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3e8,__l_22,&local_e18);
      local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"rvalue","");
      local_d78 = (string *)local_9f0;
      local_9f0[0] = local_9e0;
      std::__cxx11::string::_M_construct<char_const*>(local_d78,"VARIABLE","");
      __l_23._M_len = 2;
      __l_23._M_array = &local_a10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3d0,__l_23,&local_e19);
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,"rvalue","");
      local_d80 = (string *)local_a30;
      local_a30[0] = local_a20;
      std::__cxx11::string::_M_construct<char_const*>(local_d80,"function","");
      __l_24._M_len = 2;
      __l_24._M_array = &local_a50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3b8,__l_24,&local_e1a);
      __l_25._M_len = 0x1a;
      __l_25._M_array = (iterator)local_610;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&local_ca0,__l_25,&local_e1b);
      lVar17 = 600;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_610 + lVar17));
        lVar17 = lVar17 + -0x18;
      } while (lVar17 != -0x18);
      lVar17 = 0;
      do {
        if (local_a20 + lVar17 != *(undefined1 **)((long)local_a30 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_a30 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_9e0 + lVar17 != *(undefined1 **)((long)local_9f0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_9f0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_9a0 + lVar17 != *(undefined1 **)((long)local_9b0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_9b0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_960 + lVar17 != *(undefined1 **)((long)local_970 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_970 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_40 + lVar17 != *(undefined1 **)((long)local_50 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_50 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_620 + lVar17 != *(undefined1 **)((long)local_630 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_630 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_7e0 + lVar17 != *(undefined1 **)((long)local_7f0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_7f0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_c18 + lVar17 != *(undefined1 **)((long)local_c28 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_c28 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_b98 + lVar17 != *(undefined1 **)((long)local_ba8 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_ba8 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_2c0 + lVar17 != *(undefined1 **)((long)local_2d0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_2d0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x60);
      lVar17 = 0;
      do {
        if (local_260 + lVar17 != *(undefined1 **)((long)local_270 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_270 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x60);
      lVar17 = 0;
      do {
        if (local_920 + lVar17 != *(undefined1 **)((long)local_930 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_930 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_8e0 + lVar17 != *(undefined1 **)((long)local_8f0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_8f0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_a98 + lVar17 != *(undefined1 **)((long)local_aa8 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_aa8 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_200 + lVar17 != *(undefined1 **)((long)local_210 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_210 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x60);
      lVar17 = 0;
      do {
        if (local_cd0 + lVar17 != *(undefined1 **)((long)local_ce0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_ce0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_b18 + lVar17 != *(undefined1 **)((long)local_b28 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_b28 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_860 + lVar17 != *(undefined1 **)((long)local_870 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_870 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_7a0 + lVar17 != *(undefined1 **)((long)local_7b0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_7b0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_760 + lVar17 != *(undefined1 **)((long)local_770 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_770 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_6e0 + lVar17 != *(undefined1 **)((long)local_6f0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_6f0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_1a0 + lVar17 != *(undefined1 **)((long)local_1b0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_1b0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x60);
      lVar17 = 0;
      do {
        if (local_6a0 + lVar17 != *(undefined1 **)((long)local_6b0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_6b0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x40);
      lVar17 = 0;
      do {
        if (local_140 + lVar17 != *(undefined1 **)((long)local_150 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_150 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x60);
      lVar17 = 0;
      do {
        if (local_330 + lVar17 != *(undefined1 **)((long)local_340 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_340 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x80);
      lVar17 = 0;
      do {
        if (local_e0 + lVar17 != *(undefined1 **)((long)local_f0 + lVar17)) {
          operator_delete(*(undefined1 **)((long)local_f0 + lVar17));
        }
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x60);
      ParseTableCalculation::ParseTableCalculation
                ((ParseTableCalculation *)local_3a0,&local_ca0,
                 iVar9.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0 ||
                 iVar11.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0);
      ParseTableCalculation::calculateTable
                ((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                  *)&local_690,(ParseTableCalculation *)local_3a0);
      psVar15 = (size_type *)(ulong)print_debug;
      Parser::Parser((Parser *)local_610,&local_ca0,
                     (vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                      *)&local_690,print_debug);
      Tokenizer::Tokenizer((Tokenizer *)&local_750,&local_cc0);
      local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
      iVar5 = 0;
      local_8d0._M_string_length = 0;
      local_8d0.field_2._M_local_buf[0] = '\0';
      local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
      local_b88._M_string_length = 0;
      local_b88.field_2._M_local_buf[0] = '\0';
      do {
        iVar4 = std::__cxx11::string::compare((char *)&local_8d0);
        if (iVar4 == 0) {
          iVar5 = 0;
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            Parser::printAST((Parser *)local_610);
          }
          break;
        }
        cVar3 = Tokenizer::getNextToken((Tokenizer *)&local_750,&local_8d0,&local_b88);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur != (__node_type *)0x0 ||
            iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_8d0._M_dataplus._M_p,
                               local_8d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," [",2);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_b88._M_dataplus._M_p,local_b88._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        if ((bool)cVar3) {
          sVar13 = Parser::read((Parser *)local_610,(int)&local_8d0,&local_b88,(size_t)psVar15);
          cVar3 = (char)sVar13;
        }
        if (cVar3 == '\0') {
          iVar5 = Tokenizer::getCurrentLine((Tokenizer *)&local_750);
          uVar18 = iVar5 + 1;
          __val = -uVar18;
          if (0 < (int)uVar18) {
            __val = uVar18;
          }
          __len = 1;
          if (9 < __val) {
            uVar16 = (ulong)__val;
            uVar2 = 4;
            do {
              __len = uVar2;
              uVar6 = (uint)uVar16;
              if (uVar6 < 100) {
                __len = __len - 2;
                goto LAB_00120f78;
              }
              if (uVar6 < 1000) {
                __len = __len - 1;
                goto LAB_00120f78;
              }
              if (uVar6 < 10000) goto LAB_00120f78;
              uVar16 = uVar16 / 10000;
              uVar2 = __len + 4;
            } while (99999 < uVar6);
            __len = __len + 1;
          }
LAB_00120f78:
          local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_d40,(char)__len - (char)((int)uVar18 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_d40._M_dataplus._M_p + (uVar18 >> 0x1f),__len,__val);
          std::operator+(&local_850,"An error occurred on line ",&local_d40);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_850);
          psVar15 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_c88.field_2._M_allocated_capacity = *psVar15;
            local_c88.field_2._8_8_ = plVar14[3];
            local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
          }
          else {
            local_c88.field_2._M_allocated_capacity = *psVar15;
            local_c88._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_c88._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_c88,(ulong)local_b88._M_dataplus._M_p);
          psVar15 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_c08.field_2._M_allocated_capacity = *psVar15;
            local_c08.field_2._8_8_ = plVar14[3];
            local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
          }
          else {
            local_c08.field_2._M_allocated_capacity = *psVar15;
            local_c08._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_c08._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_c08);
          psVar15 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_b08.field_2._M_allocated_capacity = *psVar15;
            local_b08.field_2._8_8_ = plVar14[3];
            local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
          }
          else {
            local_b08.field_2._M_allocated_capacity = *psVar15;
            local_b08._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_b08._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          printError(&local_b08);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
            operator_delete(local_b08._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
            operator_delete(local_c08._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
            operator_delete(local_c88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_850._M_dataplus._M_p != &local_850.field_2) {
            operator_delete(local_850._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d40._M_dataplus._M_p != &local_d40.field_2) {
            operator_delete(local_d40._M_dataplus._M_p);
          }
          iVar5 = 1;
        }
      } while (cVar3 != '\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
        operator_delete(local_b88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
        operator_delete(local_8d0._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_750);
      std::deque<ASTNode,_std::allocator<ASTNode>_>::~deque
                ((deque<ASTNode,_std::allocator<ASTNode>_> *)(local_598 + 0x10));
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)(local_610 + 0x38));
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(local_610 + 0x20));
      std::
      vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
      ::~vector((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                 *)(local_610 + 8));
      std::
      vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
      ::~vector((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                 *)&local_690);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_348);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_380);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(local_3a0 + 8));
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_ca0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
        operator_delete(local_cc0._M_dataplus._M_p);
      }
    }
  }
  else {
    iVar5 = 0;
    printHelp();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a88);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
{
	auto args = parseArguments("filename", argc, argv);

	if (args.find("help") != args.end())
	{
		printHelp();
		return 0;
	}

	auto it_filename = args.find("filename");
	if (it_filename == args.end())
	{
		std::cout << std::endl;
		printError("No file provided");
		printHelp();
		return -1;
	}

	bool print_tokenizer_debug = args.find("tokenizer_debug") != args.end();
	bool print_table_calculation_debug = args.find("table_debug") != args.end();
	bool print_parser_debug = args.find("parser_debug") != args.end();
	if (args.find("debug") != args.end())
	{
		print_tokenizer_debug = true;
		print_table_calculation_debug = true;
		print_parser_debug = true;
	}
	bool print_ast = args.find("ast") != args.end();
	std::string filename = it_filename->second;

	std::vector<std::vector<std::string>> rules = {
		{"program", "commands", "EOF"},
		{"commands", "command", "SEMICOLON", "commands"},
		{"commands", "block", "commands"},
		{"commands", ""},
		{"command", "PRINT", "rvalue"},
		{"command", "VARIABLE", "ASSIGN", "rvalue"},
		{"command", "function_call"},
		{"command", "return"},
		{"block", "OPEN_CURLY_BRACKET", "commands", "CLOSE_CURLY_BRACKET"},
		{"function", "FUNCTION", "parameter_list", "block"},
		{"parameter_list", "OPEN_BRACKET", "parameters", "CLOSE_BRACKET"},
		{"parameter_list", "OPEN_BRACKET", "CLOSE_BRACKET"},
		{"parameters", "parameter", "COMMA", "parameters"},
		{"parameters", "parameter"},
		{"parameter", "VARIABLE"},
		{"function_call", "VARIABLE", "parameter_list"},
		{"return", "RETURN", "rvalue"},
		{"rvalue", "rvalue", "SUB", "rvalue"},
		{"rvalue", "rvalue", "ADD", "rvalue"},
		{"rvalue", "rvalue", "MUL", "rvalue"},
		{"rvalue", "rvalue", "DIV", "rvalue"},
		{"rvalue", "OPEN_BRACKET", "rvalue", "CLOSE_BRACKET"},
		{"rvalue", "STRING"},
		{"rvalue", "NUMBER"},
		{"rvalue", "VARIABLE"},
		{"rvalue", "function"}

	};
	ParseTableCalculation table_calculation(rules, print_table_calculation_debug);
	auto table = table_calculation.calculateTable();
	Parser parser(rules, table, print_parser_debug);

	Tokenizer tokenizer(filename);
	std::string token, read_string;
	while (token != "EOF")
	{
		bool success = tokenizer.getNextToken(token, read_string);
		if (print_tokenizer_debug)
		{
			std::cout << token << " [" << read_string << "]" << std::endl;
		}
		if (success)
		{
			success = parser.read(token, read_string);
		}
		if (!success)
		{
			std::string line = std::to_string(tokenizer.getCurrentLine() + 1);
			printError("An error occurred on line " + line + " when parsing [" + read_string + "]");
			return 1;
		}
	}
	if (print_ast)
	{
		parser.printAST();
	}
	return 0;
}